

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void reset(cJSON *item)

{
  cJSON *item_local;
  
  if ((item != (cJSON *)0x0) && (item->child != (cJSON *)0x0)) {
    cJSON_Delete(item->child);
  }
  if ((item->valuestring != (char *)0x0) && ((item->type & 0x100U) == 0)) {
    (*global_hooks.deallocate)(item->valuestring);
  }
  if ((item->string != (char *)0x0) && ((item->type & 0x200U) == 0)) {
    (*global_hooks.deallocate)(item->string);
  }
  memset(item,0,0x40);
  return;
}

Assistant:

void reset(cJSON *item) {
    if ((item != NULL) && (item->child != NULL))
    {
        cJSON_Delete(item->child);
    }
    if ((item->valuestring != NULL) && !(item->type & cJSON_IsReference))
    {
        global_hooks.deallocate(item->valuestring);
    }
    if ((item->string != NULL) && !(item->type & cJSON_StringIsConst))
    {
        global_hooks.deallocate(item->string);
    }

    memset(item, 0, sizeof(cJSON));
}